

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::anon_unknown_36::WebSocketImpl::sendCloseDueToError
          (WebSocketImpl *this,uint16_t code,StringPtr reason)

{
  bool bVar1;
  PromiseFulfiller<void> *pPVar2;
  Disposer *pDVar3;
  uchar *puVar4;
  size_t sVar5;
  ArrayDisposer *pAVar6;
  PromiseArena *pPVar7;
  OwnPromiseNode OVar8;
  long *plVar9;
  WeakFulfiller<void> *params;
  void *pvVar10;
  PromiseNode *extraout_RAX;
  PromiseBase PVar11;
  PromiseNode *extraout_RAX_00;
  undefined6 in_register_00000032;
  WebSocketImpl *this_00;
  PromiseArena *in_R8;
  TransformPromiseNodeBase *this_01;
  StringPtr reason_00;
  Array<unsigned_char> payload;
  OwnPromiseNode local_d0;
  WeakFulfillerBase *local_c8;
  long *local_c0;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> local_b8;
  Array<unsigned_char> local_a8;
  Array<unsigned_char> local_88;
  WebSocketImpl *local_70;
  PromiseArena *local_68;
  ControlMessage local_60;
  undefined4 extraout_var;
  
  this_00 = (WebSocketImpl *)CONCAT62(in_register_00000032,code);
  local_70 = this;
  local_68 = in_R8;
  params = (WeakFulfiller<void> *)operator_new(0x18);
  (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (params->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_00605058;
  (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_00605090;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
            ((PromiseDisposer *)&local_d0,params);
  local_c0 = (long *)0x0;
  bVar1 = (this_00->queuedControlMessage).ptr.isSet;
  reason_00.content.size_ = (size_t)in_R8;
  reason_00.content.ptr = (char *)local_68;
  local_c8 = &params->super_WeakFulfillerBase;
  serializeClose(&local_88,(WebSocketImpl *)(ulong)(uint)reason.content.ptr,
                 (uint16_t)reason.content.size_,reason_00);
  local_a8.ptr = local_88.ptr;
  local_a8.size_ = local_88.size_;
  local_a8.disposer = local_88.disposer;
  local_88.ptr = (uchar *)0x0;
  local_88.size_ = 0;
  local_b8.ptr.disposer = &(params->super_WeakFulfillerBase).super_Disposer;
  local_b8.ptr.ptr = (PromiseFulfiller<void> *)params;
  ControlMessage::ControlMessage(&local_60,'\b',&local_a8,&local_b8);
  if ((this_00->queuedControlMessage).ptr.isSet == true) {
    (this_00->queuedControlMessage).ptr.isSet = false;
    pPVar2 = (this_00->queuedControlMessage).ptr.field_1.value.fulfiller.ptr.ptr;
    if (pPVar2 != (PromiseFulfiller<void> *)0x0) {
      (this_00->queuedControlMessage).ptr.field_1.value.fulfiller.ptr.ptr =
           (PromiseFulfiller<void> *)0x0;
      pDVar3 = (this_00->queuedControlMessage).ptr.field_1.value.fulfiller.ptr.disposer;
      (**pDVar3->_vptr_Disposer)
                (pDVar3,(_func_int *)
                        ((long)&(pPVar2->super_PromiseRejector)._vptr_PromiseRejector +
                        (long)(pPVar2->super_PromiseRejector)._vptr_PromiseRejector[-2]));
    }
    puVar4 = (this_00->queuedControlMessage).ptr.field_1.value.payload.ptr;
    if (puVar4 != (uchar *)0x0) {
      sVar5 = (this_00->queuedControlMessage).ptr.field_1.value.payload.size_;
      (this_00->queuedControlMessage).ptr.field_1.value.payload.ptr = (uchar *)0x0;
      (this_00->queuedControlMessage).ptr.field_1.value.payload.size_ = 0;
      pAVar6 = (this_00->queuedControlMessage).ptr.field_1.value.payload.disposer;
      (**pAVar6->_vptr_ArrayDisposer)(pAVar6,puVar4,1,sVar5,sVar5,0);
    }
  }
  pPVar2 = local_b8.ptr.ptr;
  (this_00->queuedControlMessage).ptr.field_1.value.opcode = local_60.opcode;
  (this_00->queuedControlMessage).ptr.field_1.value.payload.ptr = local_60.payload.ptr;
  (this_00->queuedControlMessage).ptr.field_1.value.payload.size_ = local_60.payload.size_;
  local_60.payload.ptr = (uchar *)0x0;
  local_60.payload.size_ = 0;
  *(undefined4 *)((long)&(this_00->queuedControlMessage).ptr.field_1 + 0x18) =
       local_60.payload.disposer._0_4_;
  *(undefined4 *)((long)&(this_00->queuedControlMessage).ptr.field_1 + 0x1c) =
       local_60.payload.disposer._4_4_;
  *(undefined4 *)((long)&(this_00->queuedControlMessage).ptr.field_1 + 0x20) =
       local_60.fulfiller.ptr.disposer._0_4_;
  *(undefined4 *)((long)&(this_00->queuedControlMessage).ptr.field_1 + 0x24) =
       local_60.fulfiller.ptr.disposer._4_4_;
  (this_00->queuedControlMessage).ptr.field_1.value.fulfiller.ptr.ptr = local_60.fulfiller.ptr.ptr;
  local_60.fulfiller.ptr.ptr = (PromiseFulfiller<void> *)0x0;
  (this_00->queuedControlMessage).ptr.isSet = true;
  if ((WeakFulfiller<void> *)local_b8.ptr.ptr != (WeakFulfiller<void> *)0x0) {
    local_b8.ptr.ptr = (PromiseFulfiller<void> *)0x0;
    (**((Disposer *)&(local_b8.ptr.disposer)->_vptr_Disposer)->_vptr_Disposer)
              (local_b8.ptr.disposer,
               (_func_int *)
               ((long)&(((PromiseFulfiller<void> *)&pPVar2->super_PromiseRejector)->
                       super_PromiseRejector)._vptr_PromiseRejector +
               (long)(((PromiseFulfiller<void> *)&pPVar2->super_PromiseRejector)->
                     super_PromiseRejector)._vptr_PromiseRejector[-2]));
  }
  sVar5 = local_a8.size_;
  puVar4 = local_a8.ptr;
  if (local_a8.ptr != (uchar *)0x0) {
    local_a8.ptr = (uchar *)0x0;
    local_a8.size_ = 0;
    (**(local_a8.disposer)->_vptr_ArrayDisposer)(local_a8.disposer,puVar4,1,sVar5,sVar5,0);
  }
  if (bVar1 == false) {
    setUpSendingControlMessage(this_00);
  }
  OVar8.ptr = local_d0.ptr;
  pPVar7 = ((local_d0.ptr)->super_PromiseArenaMember).arena;
  if (pPVar7 == (PromiseArena *)0x0 || (ulong)((long)local_d0.ptr - (long)pPVar7) < 0x40) {
    pvVar10 = operator_new(0x400);
    this_01 = (TransformPromiseNodeBase *)((long)pvVar10 + 0x3c0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_01,&local_d0,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:3620:29)>
               ::anon_class_32_3_b9a24fbc_for_func::operator());
    *(undefined ***)((long)pvVar10 + 0x3c0) = &PTR_destroy_0061a218;
    *(WebSocketImpl **)((long)pvVar10 + 0x3e0) = this_00;
    *(short *)((long)pvVar10 + 1000) = (short)reason.content.ptr;
    *(_func_int ***)((long)pvVar10 + 0x3f0) = (_func_int **)reason.content.size_;
    *(PromiseArena **)((long)pvVar10 + 0x3f8) = local_68;
    *(void **)((long)pvVar10 + 0x3c8) = pvVar10;
  }
  else {
    ((local_d0.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_01 = (TransformPromiseNodeBase *)(local_d0.ptr + -4);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_01,&local_d0,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:3620:29)>
               ::anon_class_32_3_b9a24fbc_for_func::operator());
    OVar8.ptr[-4].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_0061a218;
    OVar8.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)this_00;
    *(short *)&OVar8.ptr[-2].super_PromiseArenaMember.arena = (short)reason.content.ptr;
    OVar8.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)reason.content.size_;
    OVar8.ptr[-1].super_PromiseArenaMember.arena = local_68;
    OVar8.ptr[-4].super_PromiseArenaMember.arena = pPVar7;
  }
  local_60._0_8_ = &DAT_0048a171;
  local_60.payload.ptr = "then";
  local_60.payload.size_ = (size_t)&DAT_4c0000058b;
  local_a8.ptr = (uchar *)this_01;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_88,(OwnPromiseNode *)&local_a8,(SourceLocation *)&local_60);
  puVar4 = local_a8.ptr;
  (local_70->super_WebSocket)._vptr_WebSocket = (_func_int **)local_88.ptr;
  PVar11.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_88.ptr;
  if ((TransformPromiseNodeBase *)local_a8.ptr != (TransformPromiseNodeBase *)0x0) {
    local_a8.ptr = (uchar *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)puVar4);
    PVar11.node.ptr = (OwnPromiseNode)(OwnPromiseNode)extraout_RAX;
  }
  plVar9 = local_c0;
  if (local_c0 != (long *)0x0) {
    local_c0 = (long *)0x0;
    PVar11.node.ptr._0_4_ =
         (**(local_c8->super_Disposer)._vptr_Disposer)
                   (local_c8,(long)plVar9 + *(long *)(*plVar9 + -0x10));
    PVar11.node.ptr._4_4_ = extraout_var;
  }
  OVar8.ptr = local_d0.ptr;
  if (&(local_d0.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_d0.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar8.ptr)->super_PromiseArenaMember);
    PVar11.node.ptr = (OwnPromiseNode)(OwnPromiseNode)extraout_RAX_00;
  }
  return (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>)
         PVar11.node.ptr;
}

Assistant:

kj::Promise<Message> sendCloseDueToError(uint16_t code, kj::StringPtr reason){
    auto paf = newPromiseAndFulfiller<void>();
    queueClose(code, reason, kj::mv(paf.fulfiller));

    return paf.promise.then([this, code, reason]() -> kj::Promise<Message> {
        return errorHandler.handleWebSocketProtocolError({
            code, reason
          });
      });
  }